

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O2

size_t __thiscall LatencyItem::getNumStacks(LatencyItem *this)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  
  uVar1 = (this->statName)._M_string_length;
  uVar3 = 0;
  sVar4 = 0;
  while( true ) {
    if (uVar1 <= uVar3) {
      return sVar4;
    }
    lVar2 = std::__cxx11::string::find((char *)this,0x10a192);
    if (lVar2 == -1) break;
    uVar3 = lVar2 + 4;
    sVar4 = sVar4 + 1;
  }
  return sVar4;
}

Assistant:

size_t getNumStacks() const {
        size_t pos = 0;
        size_t str_size = statName.size();
        size_t ret = 0;
        while (pos < str_size) {
            pos = statName.find(" ## ", pos);
            if (pos == std::string::npos) break;
            pos += 4;
            ret++;
        }
        return ret;
    }